

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

linked_ptr<const_testing::MatcherInterface<const_void_*>_> * __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::operator=
          (linked_ptr<const_testing::MatcherInterface<const_void_*>_> *this,
          linked_ptr<const_testing::MatcherInterface<const_void_*>_> *ptr)

{
  linked_ptr<const_testing::MatcherInterface<const_void_*>_> *in_RSI;
  linked_ptr<const_testing::MatcherInterface<const_void_*>_> *in_RDI;
  
  if (in_RSI != in_RDI) {
    depart(in_RSI);
    linked_ptr<testing::MatcherInterface<void_const*>const>::
    copy<testing::MatcherInterface<void_const*>const>(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }